

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

iterator * __thiscall
google::protobuf::Map<long,_double>::erase
          (iterator *__return_storage_ptr__,Map<long,_double> *this,iterator pos)

{
  value_type *pvVar1;
  iterator it;
  Node *pNVar2;
  InnerMap *pIVar3;
  size_type sVar4;
  iterator i;
  
  if ((this->arena_ == (Arena *)0x0) &&
     (pvVar1 = ((pos.it_.node_)->kv).v_, pvVar1 != (value_type *)0x0)) {
    operator_delete(pvVar1,0x10);
  }
  sVar4 = pos.it_.bucket_index_;
  pIVar3 = pos.it_.m_;
  pNVar2 = pos.it_.node_;
  InnerMap::iterator_base<google::protobuf::Map<long,_double>::KeyValuePair>::operator++(&pos.it_);
  it.m_ = pIVar3;
  it.node_ = pNVar2;
  it.bucket_index_ = sVar4;
  InnerMap::erase(this->elements_,it);
  (__return_storage_ptr__->it_).bucket_index_ = pos.it_.bucket_index_;
  (__return_storage_ptr__->it_).node_ = pos.it_.node_;
  (__return_storage_ptr__->it_).m_ = pos.it_.m_;
  return __return_storage_ptr__;
}

Assistant:

iterator erase(iterator pos) {
    if (arena_ == NULL) delete pos.operator->();
    iterator i = pos++;
    elements_->erase(i.it_);
    return pos;
  }